

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void * smalloc(small_alloc *alloc,size_t size)

{
  small_mempool *pool_00;
  small_mempool *small_mempool_00;
  slab *slab_00;
  small_alloc *local_40;
  void *ptr;
  mempool *pool;
  slab *slab;
  small_mempool *small_mempool;
  size_t size_local;
  small_alloc *alloc_local;
  
  small_mempool_00 = small_mempool_search(alloc,size);
  if (small_mempool_00 == (small_mempool *)0x0) {
    slab_00 = slab_get_large(alloc->cache,size);
    if (slab_00 == (slab *)0x0) {
      alloc_local = (small_alloc *)0x0;
    }
    else {
      alloc_local = (small_alloc *)slab_data(slab_00);
    }
  }
  else {
    pool_00 = small_mempool_00->used_pool;
    if ((pool_00->pool).objsize < size) {
      __assert_fail("size <= pool->objsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x155,"void *smalloc(struct small_alloc *, size_t)");
    }
    local_40 = (small_alloc *)mempool_alloc(&pool_00->pool);
    if (local_40 == (small_alloc *)0x0) {
      small_mempool_group_sweep_sparse(alloc);
      local_40 = (small_alloc *)mempool_alloc(&pool_00->pool);
    }
    if (((local_40 != (small_alloc *)0x0) && (small_mempool_00->used_pool != small_mempool_00)) &&
       (small_mempool_00->waste =
             (ulong)((small_mempool_00->used_pool->pool).objsize - (small_mempool_00->pool).objsize)
             + small_mempool_00->waste,
       small_mempool_00->group->waste_max <= small_mempool_00->waste)) {
      small_mempool_activate(small_mempool_00);
    }
    alloc_local = local_40;
  }
  return alloc_local;
}

Assistant:

void *
smalloc(struct small_alloc *alloc, size_t size)
{
	struct small_mempool *small_mempool = small_mempool_search(alloc, size);
	if (small_mempool == NULL) {
		/* Object is too large, fallback to slab_cache */
		struct slab *slab = slab_get_large(alloc->cache, size);
		if (slab == NULL)
			return NULL;
		return slab_data(slab);
	}
	struct mempool *pool = &small_mempool->used_pool->pool;
	assert(size <= pool->objsize);
	void *ptr = mempool_alloc(pool);
	if (ptr == NULL) {
		/*
		 * In case we run out of memory let's try to deactivate some
		 * pools and release their sparse slabs. It might not help tho.
		 */
		small_mempool_group_sweep_sparse(alloc);
		ptr = mempool_alloc(pool);
	}

	if (ptr != NULL && small_mempool->used_pool != small_mempool) {
		/*
		 * Waste for this allocation is the difference between
		 * the size of objects optimal (i.e. best-fit) mempool and
		 * used mempool.
		 */
		small_mempool->waste +=
			(small_mempool->used_pool->pool.objsize -
			 small_mempool->pool.objsize);
		/*
		 * In case when waste for this mempool becomes greater than
		 * or equal to waste_max, we are updating the information
		 * for the mempool group that this mempool belongs to,
		 * that it can now be used for memory allocation.
		 */
		if (small_mempool->waste >= small_mempool->group->waste_max)
			small_mempool_activate(small_mempool);
	}

	return ptr;
}